

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOFX.c
# Opt level: O1

uint32_t FAPOFX_CreateFX(FAudioGUID *clsid,FAPO **pEffect,void *pInitData,uint32_t InitDataByteSize)

{
  uint32_t uVar1;
  
  uVar1 = FAPOFX_CreateFXWithCustomAllocatorEXT
                    (clsid,pEffect,pInitData,InitDataByteSize,SDL_malloc,SDL_free,SDL_realloc);
  return uVar1;
}

Assistant:

uint32_t FAPOFX_CreateFX(
	const FAudioGUID *clsid,
	FAPO **pEffect,
	const void *pInitData,
	uint32_t InitDataByteSize
) {
	return FAPOFX_CreateFXWithCustomAllocatorEXT(
		clsid,
		pEffect,
		pInitData,
		InitDataByteSize,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}